

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall
HighsCutGeneration::cmirCutGenerationHeuristic
          (HighsCutGeneration *this,double minEfficacy,bool onlyInitialCMIRScale)

{
  pointer pdVar1;
  pointer piVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  long lVar8;
  size_t i;
  ulong uVar9;
  int *piVar10;
  HighsCDouble *__x;
  vector<double,_std::allocator<double>_> *this_00;
  int *piVar11;
  HighsInt k;
  int iVar12;
  uint uVar13;
  double *pdVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  HighsCDouble HVar25;
  undefined4 local_138;
  undefined4 uStack_134;
  HighsCDouble scale;
  HighsCDouble scalrhs;
  double local_d8;
  double continuoussqrnorm;
  double continuouscontribution;
  HighsCDouble *local_98;
  HighsCDouble local_90;
  HighsCDouble aj;
  HighsCDouble fj;
  HighsCDouble scalaj;
  HighsCDouble f0;
  HighsCDouble oneoveroneminusf0;
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  continuouscontribution = 0.0;
  continuoussqrnorm = 0.0;
  this_00 = &this->deltas;
  pdVar1 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(long)this->rowlen + 3);
  piVar2 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->integerinds,(long)this->rowlen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->complementation,(long)this->rowlen);
  iVar12 = 0;
  local_138 = 0;
  uStack_134 = 0;
  while( true ) {
    dVar17 = continuoussqrnorm;
    scalrhs.hi = (double)CONCAT44(scalrhs.hi._4_4_,iVar12);
    dVar19 = (double)CONCAT44(uStack_134,local_138);
    if (iVar12 == this->rowlen) break;
    if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[iVar12] == '\0') {
      updateViolationAndNorm
                (this,iVar12,this->vals[iVar12],&continuouscontribution,&continuoussqrnorm);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->integerinds,(value_type_conflict2 *)&scalrhs);
      dVar17 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[scalrhs.hi._0_4_];
      dVar17 = dVar17 + dVar17;
      pdVar14 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + scalrhs.hi._0_4_;
      iVar12 = scalrhs.hi._0_4_;
      if (*pdVar14 <= dVar17 && dVar17 != *pdVar14) {
        flipComplementation(this,scalrhs.hi._0_4_);
        iVar12 = scalrhs.hi._0_4_;
      }
      if (((!onlyInitialCMIRScale) &&
          (dVar17 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar12],
          this->feastol <= dVar17 && dVar17 != this->feastol)) &&
         (scale.hi = ABS(this->vals[iVar12]), 0.0001 < scale.hi)) {
        if ((scale.hi != dVar19) || (NAN(scale.hi) || NAN(dVar19))) {
          dVar17 = scale.hi;
          if (scale.hi <= dVar19) {
            dVar17 = dVar19;
          }
          std::vector<double,_std::allocator<double>_>::push_back(this_00,&scale.hi);
          local_138 = SUB84(dVar17,0);
          uStack_134 = (undefined4)((ulong)dVar17 >> 0x20);
          iVar12 = scalrhs.hi._0_4_;
        }
      }
    }
    iVar12 = iVar12 + 1;
  }
  if (((continuoussqrnorm == 0.0) && (!NAN(continuoussqrnorm))) &&
     (8 < (ulong)((long)(this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start))) {
    dVar22 = HighsIntegers::integralScale(this_00,this->feastol,1e-14);
    if (((dVar22 != 0.0) || (NAN(dVar22))) && (dVar22 <= 10000.0)) {
      dVar18 = ((this->rhs).hi + (this->rhs).lo) * dVar22;
      dVar18 = dVar18 - (double)(long)((long)dVar18 - (ulong)(dVar18 < (double)(long)dVar18));
      if ((0.005 <= dVar18) && (dVar18 <= 0.995)) {
        scale.hi = 1.0 / dVar22;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&scale.hi);
      }
    }
  }
  scale.hi = 1.0;
  __x = &scale;
  if (this->initialScale <= 1.0 && this->initialScale != 1.0) {
    __x = (HighsCDouble *)&this->initialScale;
  }
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&__x->hi);
  if (!onlyInitialCMIRScale) {
    dVar22 = this->initialScale;
    uVar15 = SUB84(dVar22,0);
    uVar16 = (undefined4)((ulong)dVar22 >> 0x20);
    if (1.0 <= dVar22) {
      uVar15 = 0;
      uVar16 = 0x3ff00000;
    }
    scale.hi = dVar19 + (double)CONCAT44(uVar16,uVar15);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&scale.hi);
  }
  if ((this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pdqsort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
              ();
    _Var7._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dVar19 = *_Var7._M_current;
    for (uVar9 = 1; uVar9 < (ulong)((long)__last._M_current - (long)_Var7._M_current >> 3);
        uVar9 = uVar9 + 1) {
      dVar22 = _Var7._M_current[uVar9];
      if (_Var7._M_current[uVar9] - dVar19 <= this->feastol * 10.0) {
        _Var7._M_current[uVar9] = 0.0;
        dVar22 = dVar19;
      }
      dVar19 = dVar22;
    }
    scale.hi = 0.0;
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                      (_Var7,__last,(_Iter_equals_val<const_double>)&scale);
    std::vector<double,_std::allocator<double>_>::erase
              (this_00,(const_iterator)_Var7._M_current,
               (const_iterator)
               (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    dVar19 = continuouscontribution;
    pdVar14 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar3 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_98 = &this->rhs;
    local_d8 = -1.0;
    for (; pdVar14 != pdVar3; pdVar14 = pdVar14 + 1) {
      dVar22 = *pdVar14;
      dVar18 = 1.0 / dVar22;
      dVar24 = ((this->rhs).hi + (this->rhs).lo) * dVar18;
      dVar23 = (double)(long)((long)dVar24 - (ulong)(dVar24 < (double)(long)dVar24));
      dVar24 = dVar24 - dVar23;
      dVar21 = minEfficacy;
      if (((0.005 <= dVar24) && (dVar24 <= 0.995)) &&
         (dVar20 = 1.0 / (1.0 - dVar24), dVar20 <= 1000000.0)) {
        scale.hi = dVar18 * dVar18 * dVar17;
        scalrhs.hi = dVar18 * dVar19 * dVar20 - dVar23;
        pdVar4 = this->vals;
        piVar5 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar10 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; dVar23 = scalrhs.hi, piVar10 != piVar5;
            piVar10 = piVar10 + 1) {
          dVar23 = pdVar4[*piVar10] * dVar18;
          dVar21 = dVar23 + 1e-14;
          lVar8 = (long)dVar21;
          dVar21 = (double)(long)(lVar8 - (ulong)(dVar21 < (double)lVar8));
          dVar23 = (dVar23 - dVar21) - dVar24;
          if (dVar23 <= 0.0) {
            dVar23 = 0.0;
          }
          updateViolationAndNorm(this,*piVar10,dVar23 + dVar21,&scalrhs.hi,&scale.hi);
        }
        if (scale.hi < 0.0) {
          dVar18 = sqrt(scale.hi);
        }
        else {
          dVar18 = SQRT(scale.hi);
        }
        dVar23 = dVar23 / dVar18;
        dVar21 = dVar23;
        if (dVar23 <= minEfficacy) {
          dVar21 = minEfficacy;
        }
        local_d8 = (double)(~-(ulong)(minEfficacy < dVar23) & (ulong)local_d8 |
                           (ulong)dVar22 & -(ulong)(minEfficacy < dVar23));
      }
      minEfficacy = dVar21;
    }
    if ((local_d8 != -1.0) || (NAN(local_d8))) {
      for (uVar13 = 1; (!onlyInitialCMIRScale && (uVar13 < 4)); uVar13 = uVar13 + 1) {
        dVar21 = (double)(1 << ((byte)uVar13 & 0x1f)) * local_d8;
        dVar22 = 1.0 / dVar21;
        dVar24 = ((this->rhs).hi + (this->rhs).lo) * dVar22;
        dVar18 = (double)(long)((long)dVar24 - (ulong)(dVar24 < (double)(long)dVar24));
        dVar24 = dVar24 - dVar18;
        dVar23 = minEfficacy;
        if ((0.005 <= dVar24) &&
           ((dVar24 <= 0.995 && (dVar20 = 1.0 / (1.0 - dVar24), dVar20 <= 1000000.0)))) {
          scale.hi = dVar22 * dVar22 * dVar17;
          scalrhs.hi = dVar22 * dVar19 * dVar20 - dVar18;
          pdVar14 = this->vals;
          piVar5 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar10 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; dVar18 = scalrhs.hi, piVar10 != piVar5;
              piVar10 = piVar10 + 1) {
            dVar18 = pdVar14[*piVar10] * dVar22;
            dVar23 = dVar18 + 1e-14;
            lVar8 = (long)dVar23;
            dVar23 = (double)(long)(lVar8 - (ulong)(dVar23 < (double)lVar8));
            dVar18 = (dVar18 - dVar23) - dVar24;
            if (dVar18 <= 0.0) {
              dVar18 = 0.0;
            }
            updateViolationAndNorm(this,*piVar10,dVar18 + dVar23,&scalrhs.hi,&scale.hi);
          }
          if (scale.hi < 0.0) {
            dVar22 = sqrt(scale.hi);
          }
          else {
            dVar22 = SQRT(scale.hi);
          }
          dVar18 = dVar18 / dVar22;
          dVar23 = dVar18;
          if (dVar18 <= minEfficacy) {
            dVar23 = minEfficacy;
          }
          local_d8 = (double)(~-(ulong)(minEfficacy < dVar18) & (ulong)local_d8 |
                             (ulong)dVar21 & -(ulong)(minEfficacy < dVar18));
        }
        minEfficacy = dVar23;
      }
      piVar10 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      dVar22 = 1.0 / local_d8;
      do {
        if (piVar10 == piVar5) {
          scalrhs.hi = local_d8;
          scalrhs.lo = 0.0;
          HVar25 = operator/(1.0,&scalrhs);
          scale.lo = HVar25.lo;
          scale.hi = HVar25.hi;
          HVar25 = HighsCDouble::operator*(local_98,&scale);
          scalrhs.lo = HVar25.lo;
          scalrhs.hi = HVar25.hi;
          dVar19 = floor(scalrhs.hi + scalrhs.lo);
          HVar25 = HighsCDouble::operator-(&scalrhs,dVar19);
          f0.lo = HVar25.lo;
          f0.hi = HVar25.hi;
          HVar25 = operator-(1.0,&f0);
          scalaj.lo = HVar25.lo;
          scalaj.hi = HVar25.hi;
          HVar25 = operator/(1.0,&scalaj);
          oneoveroneminusf0.lo = HVar25.lo;
          oneoveroneminusf0.hi = HVar25.hi;
          (this->rhs).hi = dVar19 * local_d8;
          (this->rhs).lo = 0.0;
          this->integralSupport = true;
          this->integralCoefficients = false;
          for (uVar9 = 0; uVar9 != (uint)this->rowlen; uVar9 = uVar9 + 1) {
            dVar19 = this->vals[uVar9];
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              if ((this->isintegral).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] == '\0') {
                if (dVar19 <= 0.0) {
                  HVar25 = HighsCDouble::operator*(&oneoveroneminusf0,dVar19);
                  this->vals[uVar9] = HVar25.lo + HVar25.hi;
                  this->integralSupport = false;
                }
                else {
                  this->vals[uVar9] = 0.0;
                }
              }
              else {
                HVar25 = HighsCDouble::operator*(&scale,dVar19);
                scalaj.lo = HVar25.lo;
                scalaj.hi = HVar25.hi;
                HVar25 = HighsCDouble::operator+(&scalaj,1e-14);
                dVar19 = floor(HVar25.hi + HVar25.lo);
                HVar25 = HighsCDouble::operator-(&scalaj,dVar19);
                fj.lo = HVar25.lo;
                aj.lo = 0.0;
                fj.hi = HVar25.hi;
                aj.hi = dVar19;
                if (f0.hi + f0.lo < fj.hi + fj.lo) {
                  HVar25 = HighsCDouble::operator-(&fj,&f0);
                  local_90.lo = HVar25.lo;
                  local_90.hi = HVar25.hi;
                  HighsCDouble::operator+=(&aj,&local_90);
                }
                HVar25 = HighsCDouble::operator*(&aj,local_d8);
                this->vals[uVar9] = HVar25.lo + HVar25.hi;
              }
            }
          }
          return true;
        }
        iVar12 = *piVar10;
        dVar18 = minEfficacy;
        if (((this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar12] < INFINITY) &&
           (this->feastol <
            (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar12])) {
          flipComplementation(this,iVar12);
          dVar23 = ((this->rhs).hi + (this->rhs).lo) * dVar22;
          dVar18 = (double)(long)((long)dVar23 - (ulong)(dVar23 < (double)(long)dVar23));
          dVar23 = dVar23 - dVar18;
          if ((0.005 <= dVar23) &&
             ((dVar23 <= 0.995 && (dVar21 = 1.0 / (1.0 - dVar23), dVar21 <= 1000000.0)))) {
            scalrhs.hi = dVar21 * dVar19 * dVar22 - dVar18;
            pdVar14 = this->vals;
            piVar6 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            scale.hi = dVar17 * dVar22 * dVar22;
            for (piVar11 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start; dVar21 = scalrhs.hi, piVar11 != piVar6
                ; piVar11 = piVar11 + 1) {
              dVar18 = pdVar14[*piVar11] * dVar22;
              dVar21 = dVar18 + 1e-14;
              lVar8 = (long)dVar21;
              dVar21 = (double)(long)(lVar8 - (ulong)(dVar21 < (double)lVar8));
              dVar18 = (dVar18 - dVar21) - dVar23;
              if (dVar18 <= 0.0) {
                dVar18 = 0.0;
              }
              updateViolationAndNorm(this,*piVar11,dVar18 + dVar21,&scalrhs.hi,&scale.hi);
            }
            if (scale.hi < 0.0) {
              dVar23 = sqrt(scale.hi);
            }
            else {
              dVar23 = SQRT(scale.hi);
            }
            dVar18 = dVar21 / dVar23;
            if (minEfficacy < dVar21 / dVar23) goto LAB_0029256d;
          }
          flipComplementation(this,iVar12);
          dVar18 = minEfficacy;
        }
LAB_0029256d:
        piVar10 = piVar10 + 1;
        minEfficacy = dVar18;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool HighsCutGeneration::cmirCutGenerationHeuristic(double minEfficacy,
                                                    bool onlyInitialCMIRScale) {
  using std::abs;
  using std::floor;
  using std::max;
  using std::sqrt;

  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  double continuouscontribution = 0.0;
  double continuoussqrnorm = 0.0;

  deltas.clear();
  deltas.reserve(rowlen + 3);
  integerinds.clear();
  integerinds.reserve(rowlen);

  double maxabsdelta = 0.0;
  constexpr double maxCMirScale = 1e6;
  constexpr double f0min = 0.005;
  constexpr double f0max = 0.995;

  complementation.resize(rowlen);

  for (HighsInt i = 0; i != rowlen; ++i) {
    if (isintegral[i]) {
      integerinds.push_back(i);

      if (upper[i] < 2 * solval[i]) flipComplementation(i);

      if (onlyInitialCMIRScale) continue;

      if (solval[i] > feastol) {
        double delta = abs(vals[i]);
        if (delta <= 1e-4 || delta == maxabsdelta) continue;
        maxabsdelta = max(maxabsdelta, delta);
        deltas.push_back(delta);
      }
    } else {
      updateViolationAndNorm(i, vals[i], continuouscontribution,
                             continuoussqrnorm);
    }
  }

  if (continuoussqrnorm == 0 && deltas.size() > 1) {
    double intScale = HighsIntegers::integralScale(deltas, feastol, kHighsTiny);

    if (intScale != 0.0 && intScale <= 1e4) {
      double scalrhs = double(rhs) * intScale;
      double downrhs = fast_floor(scalrhs);

      double f0 = scalrhs - downrhs;
      if (f0 >= f0min && f0 <= f0max) deltas.push_back(1.0 / intScale);
    }
  }

  deltas.push_back(std::min(1.0, initialScale));
  if (!onlyInitialCMIRScale)
    deltas.push_back(maxabsdelta + std::min(1.0, initialScale));

  if (deltas.empty()) return false;

  pdqsort(deltas.begin(), deltas.end());
  double curdelta = deltas[0];
  for (size_t i = 1; i < deltas.size(); ++i) {
    if (deltas[i] - curdelta <= 10 * feastol)
      deltas[i] = 0.0;
    else
      curdelta = deltas[i];
  }

  deltas.erase(std::remove(deltas.begin(), deltas.end(), 0.0), deltas.end());
  double bestdelta = -1;
  double bestefficacy = minEfficacy;

  for (double delta : deltas) {
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;
    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  if (bestdelta == -1) return false;

  /* try if multiplying best delta by 2 4 or 8 gives a better efficacy */
  for (HighsInt k = 1; !onlyInitialCMIRScale && k <= 3; ++k) {
    double delta = bestdelta * (1 << k);
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);
    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  assert(bestdelta != -1);

  // try to flip complementation of integers to increase efficacy
  for (HighsInt k : integerinds) {
    if (upper[k] == kHighsInf) continue;
    if (solval[k] <= feastol) continue;

    flipComplementation(k);

    double delta = bestdelta;
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) {
      flipComplementation(k);
      continue;
    }

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) {
      flipComplementation(k);
      continue;
    }

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestefficacy = efficacy;
    } else {
      flipComplementation(k);
    }
  }

  HighsCDouble scale = 1.0 / HighsCDouble(bestdelta);
  HighsCDouble scalrhs = rhs * scale;
  double downrhs = floor(double(scalrhs));

  HighsCDouble f0 = scalrhs - downrhs;
  HighsCDouble oneoveroneminusf0 = 1.0 / (1.0 - f0);

  rhs = downrhs * bestdelta;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt j = 0; j != rowlen; ++j) {
    if (vals[j] == 0.0) continue;
    if (!isintegral[j]) {
      if (vals[j] > 0.0)
        vals[j] = 0.0;
      else {
        vals[j] = double(vals[j] * oneoveroneminusf0);
        integralSupport = false;
      }
    } else {
      HighsCDouble scalaj = scale * vals[j];
      double downaj = floor(double(scalaj + kHighsTiny));
      HighsCDouble fj = scalaj - downaj;
      HighsCDouble aj = downaj;
      if (fj > f0) aj += fj - f0;

      vals[j] = double(aj * bestdelta);
    }
  }

  return true;
}